

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O2

void __thiscall
dbwrapper_tests::iterator_string_ordering::test_method(iterator_string_ordering *this)

{
  long lVar1;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> this_00;
  readonly_property<bool> rVar2;
  long lVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  uint32_t *in_R9;
  iterator pvVar6;
  StringContentsSerializer *pSVar7;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  assertion_result *in_stack_fffffffffffffcd0;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  uint32_t value_1;
  uint local_1e0;
  int seek_start;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> it;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [16];
  undefined1 *local_1a0;
  char **local_198;
  assertion_result local_190;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  uint32_t value;
  undefined4 uStack_154;
  StringContentsSerializer key_1;
  string key;
  CDBWrapper dbw;
  path local_88;
  path ph;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&ph,(path *)&local_88,"iterator_string_ordering");
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::path((path *)&key,&ph.super_path);
  CDBWrapper::CDBWrapper(&dbw,(DBParams *)&key);
  std::filesystem::__cxx11::path::~path((path *)&key);
  iVar4 = 0;
  while (it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl._0_4_ = iVar4, iVar4 < 10) {
    for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
      util::ToString<int>(&key,(int *)&it);
      iVar8 = iVar4;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
      }
      _value = CONCAT44(uStack_154,
                        (int)it._M_t.
                             super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                             .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl *
                        (int)it._M_t.
                             super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                             .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
      local_168 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_160 = "";
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      local_170 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x169;
      file.m_begin = (iterator)&local_168;
      msg.m_end = (iterator)in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg)
      ;
      std::__cxx11::string::string
                ((string *)&key_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
      bVar9 = CDBWrapper::Write<dbwrapper_tests::StringContentsSerializer,unsigned_int>
                        (&dbw,&key_1,&value,false);
      local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar9;
      local_190.m_message.px = (element_type *)0x0;
      local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1c0 = "dbw.Write(StringContentsSerializer{key}, value)";
      local_1b8 = "";
      local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
      local_1b0._0_8_ = &PTR__lazy_ostream_011481f0;
      local_1a0 = boost::unit_test::lazy_ostream::inst;
      local_198 = &local_1c0;
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
      ;
      local_1c8 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (uint32_t *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_190,(lazy_ostream *)local_1b0,1,0,WARN,(check_type)in_stack_fffffffffffffcd0
                 ,(size_t)&local_1d0,0x169);
      boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
      std::__cxx11::string::~string((string *)&key_1);
      std::__cxx11::string::~string((string *)&key);
    }
    iVar4 = (int)it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                 super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                 super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl + 1;
  }
  it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       CDBWrapper::NewIterator(&dbw);
  _value = 0x500000000;
  lVar3 = 0;
  do {
    this_00._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
    super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
    super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
         it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
    if (lVar3 == 8) {
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&it);
      CDBWrapper::~CDBWrapper(&dbw);
      std::filesystem::__cxx11::path::~path(&ph.super_path);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    seek_start = *(int *)((long)&value + lVar3);
    util::ToString<int>(&key_1.str,&seek_start);
    std::__cxx11::string::string((string *)&key,&key_1.str);
    CDBIterator::Seek<dbwrapper_tests::StringContentsSerializer>
              ((CDBIterator *)
               this_00._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
               _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
               super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,
               (StringContentsSerializer *)&key);
    std::__cxx11::string::~string((string *)&key);
    std::__cxx11::string::~string((string *)&key_1);
    for (local_1e0 = seek_start; local_1e0 < 10; local_1e0 = local_1e0 + 1) {
      for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
        util::ToString<unsigned_int>(&key,&local_1e0);
        iVar8 = iVar4;
        while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key);
        }
        key_1.str._M_dataplus._M_p = (pointer)&key_1.str.field_2;
        key_1.str._M_string_length = 0;
        key_1.str.field_2._M_allocated_capacity =
             key_1.str.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_1f0 = "";
        local_208 = &boost::unit_test::basic_cstring<char_const>::null;
        local_200 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x177;
        file_00.m_begin = (iterator)&local_1f8;
        msg_00.m_end = (iterator)in_R9;
        msg_00.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208
                   ,msg_00);
        bVar9 = CDBIterator::Valid((CDBIterator *)
                                   it._M_t.
                                   super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                   .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
        local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar9;
        local_190.m_message.px = (element_type *)0x0;
        local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1c0 = "it->Valid()";
        local_1b8 = "";
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_011481f0;
        local_1a0 = boost::unit_test::lazy_ostream::inst;
        local_198 = &local_1c0;
        local_218 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_210 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (uint32_t *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_190,(lazy_ostream *)local_1b0,1,0,WARN,
                   (check_type)in_stack_fffffffffffffcd0,(size_t)&local_218,0x177);
        boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
        bVar9 = CDBIterator::Valid((CDBIterator *)
                                   it._M_t.
                                   super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                                   .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
        if (!bVar9) {
          std::__cxx11::string::~string((string *)&key_1);
          std::__cxx11::string::~string((string *)&key);
          break;
        }
        local_228 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_220 = "";
        local_238 = &boost::unit_test::basic_cstring<char_const>::null;
        local_230 = &boost::unit_test::basic_cstring<char_const>::null;
        file_01.m_end = (iterator)0x17a;
        file_01.m_begin = (iterator)&local_228;
        msg_01.m_end = (iterator)in_R9;
        msg_01.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_238
                   ,msg_01);
        rVar2.super_class_property<bool>.value =
             (class_property<bool>)
             CDBIterator::GetKey<dbwrapper_tests::StringContentsSerializer>
                       ((CDBIterator *)
                        it._M_t.
                        super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                        super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                        super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key_1);
        local_190.m_message.px = (element_type *)0x0;
        local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1c0 = "it->GetKey(key)";
        local_1b8 = "";
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_011481f0;
        local_1a0 = boost::unit_test::lazy_ostream::inst;
        local_198 = &local_1c0;
        local_248 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_240 = "";
        pvVar5 = &DAT_00000001;
        pvVar6 = (iterator)0x0;
        local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)rVar2.super_class_property<bool>.value;
        boost::test_tools::tt_detail::report_assertion
                  (&local_190,(lazy_ostream *)local_1b0,1,0,WARN,
                   (check_type)in_stack_fffffffffffffcd0,(size_t)&local_248,0x17a);
        boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
        local_258 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_250 = "";
        local_268 = &boost::unit_test::basic_cstring<char_const>::null;
        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0x17b;
        file_02.m_begin = (iterator)&local_258;
        msg_02.m_end = pvVar6;
        msg_02.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_268
                   ,msg_02);
        local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             CDBIterator::GetValue<unsigned_int>
                       ((CDBIterator *)
                        it._M_t.
                        super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                        super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                        super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&value_1);
        local_190.m_message.px = (element_type *)0x0;
        local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1c0 = "it->GetValue(value)";
        local_1b8 = "";
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_011481f0;
        local_1a0 = boost::unit_test::lazy_ostream::inst;
        local_198 = &local_1c0;
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_270 = "";
        pvVar5 = &DAT_00000001;
        pvVar6 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_190,(lazy_ostream *)local_1b0,1,0,WARN,
                   (check_type)in_stack_fffffffffffffcd0,(size_t)&local_278,0x17b);
        boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
        local_288 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_280 = "";
        local_298 = &boost::unit_test::basic_cstring<char_const>::null;
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0x17c;
        file_03.m_begin = (iterator)&local_288;
        msg_03.m_end = pvVar6;
        msg_03.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_298
                   ,msg_03);
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_011480b0;
        local_1a0 = boost::unit_test::lazy_ostream::inst;
        local_198 = (char **)0xc7f1cc;
        local_2a8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2a0 = "";
        pvVar5 = (iterator)0x2;
        pSVar7 = &key_1;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_1b0,&local_2a8,0x17c,1,2,pSVar7,"key.str",(path *)&key,"exp_key");
        local_2b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2b0 = "";
        local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0x17d;
        file_04.m_begin = (iterator)&local_2b8;
        msg_04.m_end = (iterator)pSVar7;
        msg_04.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c8
                   ,msg_04);
        local_1b0._8_8_ = local_1b0._8_8_ & 0xffffffffffffff00;
        local_1b0._0_8_ = &PTR__lazy_ostream_011480b0;
        local_1a0 = boost::unit_test::lazy_ostream::inst;
        local_198 = (char **)0xc7f1cc;
        local_2d8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
        ;
        local_2d0 = "";
        local_190._0_4_ = local_1e0 * local_1e0;
        in_stack_fffffffffffffcd0 = &local_190;
        in_R8 = (iterator)0x2;
        in_R9 = &value_1;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
                  (local_1b0,&local_2d8,0x17d,1,2,in_R9,"value",in_stack_fffffffffffffcd0,"x*x");
        CDBIterator::Next((CDBIterator *)
                          it._M_t.
                          super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t
                          .super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                          super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
        std::__cxx11::string::~string((string *)&key_1);
        std::__cxx11::string::~string((string *)&key);
      }
    }
    local_2e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_2e0 = "";
    local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x181;
    file_05.m_begin = (iterator)&local_2e8;
    msg_05.m_end = (iterator)in_R9;
    msg_05.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2f8,
               msg_05);
    bVar9 = CDBIterator::Valid((CDBIterator *)
                               it._M_t.
                               super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                               .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    key_1.str._M_dataplus._M_p._0_1_ = !bVar9;
    key_1.str._M_string_length = 0;
    key_1.str.field_2._M_allocated_capacity = 0;
    local_1b0._0_8_ = "!it->Valid()";
    local_1b0._8_8_ = "";
    key._M_string_length._0_1_ = 0;
    key._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
    key.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    key.field_2._8_8_ = local_1b0;
    local_308 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/dbwrapper_tests.cpp"
    ;
    local_300 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (uint32_t *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&key_1,(lazy_ostream *)&key,1,0,WARN,
               (check_type)in_stack_fffffffffffffcd0,(size_t)&local_308,0x181);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&key_1.str.field_2._M_allocated_capacity);
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(iterator_string_ordering)
{
    fs::path ph = m_args.GetDataDirBase() / "iterator_string_ordering";
    CDBWrapper dbw({.path = ph, .cache_bytes = 1 << 20, .memory_only = true, .wipe_data = false, .obfuscate = false});
    for (int x = 0; x < 10; ++x) {
        for (int y = 0; y < 10; ++y) {
            std::string key{ToString(x)};
            for (int z = 0; z < y; ++z)
                key += key;
            uint32_t value = x*x;
            BOOST_CHECK(dbw.Write(StringContentsSerializer{key}, value));
        }
    }

    std::unique_ptr<CDBIterator> it(const_cast<CDBWrapper&>(dbw).NewIterator());
    for (const int seek_start : {0, 5}) {
        it->Seek(StringContentsSerializer{ToString(seek_start)});
        for (unsigned int x = seek_start; x < 10; ++x) {
            for (int y = 0; y < 10; ++y) {
                std::string exp_key{ToString(x)};
                for (int z = 0; z < y; ++z)
                    exp_key += exp_key;
                StringContentsSerializer key;
                uint32_t value;
                BOOST_CHECK(it->Valid());
                if (!it->Valid()) // Avoid spurious errors about invalid iterator's key and value in case of failure
                    break;
                BOOST_CHECK(it->GetKey(key));
                BOOST_CHECK(it->GetValue(value));
                BOOST_CHECK_EQUAL(key.str, exp_key);
                BOOST_CHECK_EQUAL(value, x*x);
                it->Next();
            }
        }
        BOOST_CHECK(!it->Valid());
    }
}